

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

double __thiscall
NEST::NESTcalc::RecombOmegaER
          (NESTcalc *this,double efield,double elecFrac,
          vector<double,_std::allocator<double>_> *NRERWidthsParam)

{
  double dVar1;
  const_reference pvVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 local_60;
  double omega;
  double norm;
  double mode;
  double skew;
  double cntr;
  double wide;
  double ampl;
  vector<double,_std::allocator<double>_> *NRERWidthsParam_local;
  double elecFrac_local;
  double efield_local;
  NESTcalc *this_local;
  
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,7);
  dVar7 = *pvVar2;
  dVar3 = pow(efield / 295.2,251.6);
  dVar3 = pow(dVar3 + 1.0,0.0069114);
  wide = (dVar7 - 0.086036) / dVar3 + 0.086036;
  if (wide < 0.0) {
    wide = 0.0;
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,8);
  dVar7 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,9);
  dVar3 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,10);
  dVar1 = *pvVar2;
  dVar4 = sqrt(dVar1 * dVar1 + 1.0);
  dVar4 = dVar3 + (dVar1 * 0.7978845608028653 * dVar7) / dVar4;
  dVar5 = pow(dVar4 - dVar3,2.0);
  dVar5 = exp((dVar5 * -0.5) / (dVar7 * dVar7));
  dVar4 = erf((dVar1 * (dVar4 - dVar3)) / (dVar7 * 1.414213562373095));
  dVar6 = pow(elecFrac - dVar3,2.0);
  dVar6 = exp((dVar6 * -0.5) / (dVar7 * dVar7));
  dVar7 = erf((dVar1 * (elecFrac - dVar3)) / (dVar7 * 1.414213562373095));
  local_60 = (1.0 / (dVar5 * (dVar4 + 1.0))) * wide * dVar6 * (dVar7 + 1.0);
  if (local_60 < 0.0) {
    local_60 = 0.0;
  }
  return local_60;
}

Assistant:

double NESTcalc::RecombOmegaER(double efield, double elecFrac,
                               const std::vector<double> &NRERWidthsParam) {
  double ampl;
  ampl = 0.086036 + (NRERWidthsParam[7] - 0.086036) /
    pow(1. + pow(efield / 295.2, 251.6), 0.0069114);
  // NRERWidthsParam[7] sets the lower-asymptote of field-dependence of ampl
  if (ampl < 0.) ampl = 0.;
  double wide = NRERWidthsParam[8];  // Width of omega vs. electron-fraction
                                     // (i.e. recomb. prob.)
  double cntr =
      NRERWidthsParam[9];  // Center of omega vs. elec-frac
  double skew =
      NRERWidthsParam[10]; // Skewness of omega vs. elec-frac distribution
  double mode = cntr + 2. * inv_sqrt2_PI * skew * wide / sqrt(1. + skew * skew);
  double norm =
      1. / (exp(-0.5 * pow(mode - cntr, 2.) / (wide * wide)) *
            (1. + erf(skew * (mode - cntr) /
                      (wide * sqrt2))));  // makes sure omega never exceeds ampl
  double omega = norm * ampl *
                 exp(-0.5 * pow(elecFrac - cntr, 2.) / (wide * wide)) *
                 (1. + erf(skew * (elecFrac - cntr) / (wide * sqrt2)));
  if (omega < 0.) omega = 0;
  return omega;
}